

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::EquiWidthBinsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  pointer function_00;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  undefined4 in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7fc;
  FunctionNullHandling in_stack_fffffffffffff808;
  bind_lambda_function_t in_stack_fffffffffffff810;
  LogicalType local_7e8;
  LogicalType local_7d0 [4];
  scalar_function_t local_770;
  scalar_function_t local_750;
  scalar_function_t local_730;
  scalar_function_t local_710;
  LogicalType local_6f0;
  LogicalType local_6d8;
  LogicalType local_6c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6a8;
  LogicalType local_690;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_678;
  LogicalType local_660;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_648;
  LogicalType local_630;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_618;
  LogicalType local_600;
  LogicalType local_5e8;
  LogicalType local_5d0;
  LogicalType local_5b8;
  string local_5a0;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string((string *)&local_5a0,"equi_width_bins",(allocator *)local_7d0);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_5a0);
  ::std::__cxx11::string::~string((string *)&local_5a0);
  LogicalType::LogicalType(local_7d0,BIGINT);
  LogicalType::LogicalType(local_7d0 + 1,BIGINT);
  LogicalType::LogicalType(local_7d0 + 2,BIGINT);
  LogicalType::LogicalType(local_7d0 + 3,BOOLEAN);
  __l._M_len = 4;
  __l._M_array = local_7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_618,__l,(allocator_type *)&stack0xfffffffffffff817);
  LogicalType::LogicalType(&local_7e8,ANY);
  LogicalType::LIST(&local_630,&local_7e8);
  local_710.super__Function_base._M_functor._8_8_ = 0;
  local_710.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<long,duckdb::EquiWidthBinsInteger>;
  local_710._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_710.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5b8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_5b8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff7f4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff7fc;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_618,&local_630,&local_710,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff808,
             in_stack_fffffffffffff810);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  ScalarFunction::~ScalarFunction(&local_208);
  LogicalType::~LogicalType(&local_5b8);
  ::std::_Function_base::~_Function_base(&local_710.super__Function_base);
  LogicalType::~LogicalType(&local_630);
  LogicalType::~LogicalType(&local_7e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_618);
  lVar2 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_7d0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_7d0,DOUBLE);
  LogicalType::LogicalType(local_7d0 + 1,DOUBLE);
  LogicalType::LogicalType(local_7d0 + 2,BIGINT);
  LogicalType::LogicalType(local_7d0 + 3,BOOLEAN);
  __l_00._M_len = 4;
  __l_00._M_array = local_7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_648,__l_00,(allocator_type *)&stack0xfffffffffffff817);
  LogicalType::LogicalType(&local_7e8,ANY);
  LogicalType::LIST(&local_660,&local_7e8);
  local_730.super__Function_base._M_functor._8_8_ = 0;
  local_730.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>;
  local_730._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_730.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5d0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_5d0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7f4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7fc;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_648,&local_660,&local_730,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff808,
             in_stack_fffffffffffff810);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  ScalarFunction::~ScalarFunction(&local_330);
  LogicalType::~LogicalType(&local_5d0);
  ::std::_Function_base::~_Function_base(&local_730.super__Function_base);
  LogicalType::~LogicalType(&local_660);
  LogicalType::~LogicalType(&local_7e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_648);
  lVar2 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_7d0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_7d0,TIMESTAMP);
  LogicalType::LogicalType(local_7d0 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_7d0 + 2,BIGINT);
  LogicalType::LogicalType(local_7d0 + 3,BOOLEAN);
  __l_01._M_len = 4;
  __l_01._M_array = local_7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_678,__l_01,(allocator_type *)&stack0xfffffffffffff817);
  LogicalType::LogicalType(&local_7e8,ANY);
  LogicalType::LIST(&local_690,&local_7e8);
  local_750.super__Function_base._M_functor._8_8_ = 0;
  local_750.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<duckdb::timestamp_t,duckdb::EquiWidthBinsTimestamp>;
  local_750._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_750.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5e8,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_5e8;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7f4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7fc;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_678,&local_690,&local_750,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff808,
             in_stack_fffffffffffff810);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  ScalarFunction::~ScalarFunction(&local_458);
  LogicalType::~LogicalType(&local_5e8);
  ::std::_Function_base::~_Function_base(&local_750.super__Function_base);
  LogicalType::~LogicalType(&local_690);
  LogicalType::~LogicalType(&local_7e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_678);
  lVar2 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_7d0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(&local_6c0,ANY);
  LogicalType::ANY_PARAMS(local_7d0,&local_6c0,0x96);
  LogicalType::LogicalType(&local_6d8,ANY);
  LogicalType::ANY_PARAMS(local_7d0 + 1,&local_6d8,0x96);
  LogicalType::LogicalType(local_7d0 + 2,BIGINT);
  LogicalType::LogicalType(local_7d0 + 3,BOOLEAN);
  __l_02._M_len = 4;
  __l_02._M_array = local_7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6a8,__l_02,(allocator_type *)&stack0xfffffffffffff817);
  LogicalType::LogicalType(&local_7e8,ANY);
  LogicalType::LIST(&local_6f0,&local_7e8);
  local_770.super__Function_base._M_functor._8_8_ = 0;
  local_770.super__Function_base._M_functor._M_unused._M_object = UnsupportedEquiWidth;
  local_770._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_770.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_600,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_600;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7f4;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7fc;
  ScalarFunction::ScalarFunction
            (&local_580,(vector<duckdb::LogicalType,_true> *)&local_6a8,&local_6f0,&local_770,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_02,CONSISTENT,in_stack_fffffffffffff808,
             in_stack_fffffffffffff810);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  ScalarFunction::~ScalarFunction(&local_580);
  LogicalType::~LogicalType(&local_600);
  ::std::_Function_base::~_Function_base(&local_770.super__Function_base);
  LogicalType::~LogicalType(&local_6f0);
  LogicalType::~LogicalType(&local_7e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6a8);
  lVar2 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_7d0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::~LogicalType(&local_6d8);
  LogicalType::~LogicalType(&local_6c0);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                     super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                     super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                     ._M_impl.super__Vector_impl_data._M_start; function_00 != pSVar1;
      function_00 = function_00 + 1) {
    function_00->serialize = EquiWidthBinSerialize;
    function_00->deserialize = EquiWidthBinDeserialize;
    BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_e0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet EquiWidthBinsFun::GetFunctions() {
	ScalarFunctionSet functions("equi_width_bins");
	functions.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<int64_t, EquiWidthBinsInteger>,
	                   BindEquiWidthFunction));
	functions.AddFunction(ScalarFunction(
	    {LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::BIGINT, LogicalType::BOOLEAN},
	    LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<double, EquiWidthBinsDouble>, BindEquiWidthFunction));
	functions.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<timestamp_t, EquiWidthBinsTimestamp>,
	                   BindEquiWidthFunction));
	functions.AddFunction(
	    ScalarFunction({LogicalType::ANY_PARAMS(LogicalType::ANY, 150), LogicalType::ANY_PARAMS(LogicalType::ANY, 150),
	                    LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), UnsupportedEquiWidth, BindEquiWidthFunction));
	for (auto &function : functions.functions) {
		function.serialize = EquiWidthBinSerialize;
		function.deserialize = EquiWidthBinDeserialize;
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}